

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-netcdf.c
# Opt level: O3

int read_var_array(coda_netcdf_product *product,int64_t *offset,int64_t num_dim_lengths,
                  int64_t *dim_length,int appendable_dim,coda_mem_record *root)

{
  size_t __size;
  ulong uVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  char *pcVar10;
  undefined1 auVar11 [12];
  bool bVar12;
  undefined1 auVar13 [15];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  long length;
  int iVar25;
  char *pcVar26;
  coda_mem_record *type;
  coda_mem_record *type_00;
  int64_t length_00;
  uint record_var;
  ulong uVar27;
  coda_mem_record *pcVar28;
  ulong uVar29;
  long lVar30;
  double invalid_value;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar34 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  coda_mem_record *attributes;
  int64_t string_length;
  int64_t num_var;
  int64_t dim_id;
  int64_t vsize;
  int64_t nelems;
  long dim [8];
  coda_conversion *local_110;
  int local_104;
  coda_mem_record *local_100;
  int local_f4;
  char *local_f0;
  int64_t local_e8;
  int local_e0;
  uint local_dc;
  ulong local_d8;
  long local_d0;
  int64_t *local_c8;
  long local_c0;
  long local_b8;
  coda_mem_record *local_b0;
  long local_a8;
  long local_a0;
  int64_t local_98;
  long local_90;
  long local_88;
  ulong local_80;
  long local_78 [9];
  undefined1 auVar33 [16];
  undefined1 auVar35 [16];
  
  local_98 = num_dim_lengths;
  iVar25 = read_bytes(product->raw_product,*offset,4,&local_f4);
  if (iVar25 < 0) {
    return -1;
  }
  auVar31 = ZEXT716(CONCAT52(CONCAT41((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte)((uint)
                                                  local_f4 >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)((uint)local_f4 >> 0x10),local_f4))
                                                  >> 0x20),local_f4) >> 0x18),
                                      (char)((uint)local_f4 >> 8)),(ushort)(byte)local_f4) &
                    0xffffff00ffffff);
  auVar31 = pshuflw(auVar31,auVar31,0x1b);
  sVar2 = auVar31._0_2_;
  sVar3 = auVar31._2_2_;
  sVar4 = auVar31._4_2_;
  sVar5 = auVar31._6_2_;
  local_f4 = CONCAT13((0 < sVar5) * (sVar5 < 0x100) * auVar31[6] - (0xff < sVar5),
                      CONCAT12((0 < sVar4) * (sVar4 < 0x100) * auVar31[4] - (0xff < sVar4),
                               CONCAT11((0 < sVar3) * (sVar3 < 0x100) * auVar31[2] - (0xff < sVar3),
                                        (0 < sVar2) * (sVar2 < 0x100) * auVar31[0] - (0xff < sVar2))
                              ));
  *offset = *offset + 4;
  iVar25 = read_length_value(product,offset,&local_b8);
  if (iVar25 != 0) {
    return -1;
  }
  if (local_f4 == 0) {
    if (local_b8 != 0) {
      pcVar26 = "invalid netCDF file (invalid value for nelems for empty var_array)";
      goto LAB_00167349;
    }
  }
  else {
    if (local_f4 != 0xb) {
      pcVar26 = "invalid netCDF file (invalid value for NC_VARIABLE tag)";
LAB_00167349:
      coda_set_error(-300,pcVar26);
      return -1;
    }
    if (0 < local_b8) {
      local_a0 = (long)appendable_dim;
      lVar30 = 0;
      local_a8 = local_b8;
      local_c8 = dim_length;
      do {
        local_100 = (coda_mem_record *)0x0;
        iVar25 = read_length_value(product,offset,&local_c0);
        length = local_c0;
        if (iVar25 != 0) {
          return -1;
        }
        __size = local_c0 + 1;
        local_d0 = lVar30;
        pcVar26 = (char *)malloc(__size);
        if (pcVar26 == (char *)0x0) {
          coda_set_error(-1,"out of memory (could not allocate %lu bytes) (%s:%u)",__size,
                         "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-netcdf.c"
                         ,0x230);
          return -1;
        }
        pcVar26[length] = '\0';
        iVar25 = read_bytes(product->raw_product,*offset,length,pcVar26);
        if (iVar25 < 0) goto LAB_001673f2;
        uVar27 = (ulong)((uint)length & 3);
        lVar30 = ((*offset + length) - uVar27) + 4;
        if (uVar27 == 0) {
          lVar30 = *offset + length;
        }
        *offset = lVar30;
        iVar25 = read_length_value(product,offset,(int64_t *)&local_80);
        uVar27 = local_80;
        if (iVar25 != 0) goto LAB_001673f2;
        if ((long)local_80 < 1) {
          local_e8 = 0;
          bVar12 = true;
          record_var = 0;
          local_104 = 0;
        }
        else {
          uVar1 = local_80 - 1;
          uVar29 = 0;
          local_104 = 0;
          record_var = 0;
          bVar12 = false;
          local_e8 = 0;
          local_f0 = pcVar26;
          local_b0 = root;
          do {
            iVar25 = read_length_value(product,offset,&local_90);
            pcVar26 = local_f0;
            if (iVar25 != 0) goto LAB_001673f2;
            if ((local_90 < 0) || (local_98 <= local_90)) {
              coda_set_error(-300,"invalid netCDF file (invalid dimid for variable %s)",local_f0);
              goto LAB_001673f2;
            }
            if (uVar1 == uVar29) {
              local_e8 = local_c8[local_90];
              bVar12 = true;
            }
            else if (uVar29 < 8) {
              local_78[uVar29] = local_c8[local_90];
              local_104 = local_104 + 1;
            }
            else {
              local_78[7] = local_c8[local_90] * local_78[7];
            }
            if (uVar29 == 0) {
              record_var = (uint)(local_90 == local_a0);
            }
            uVar29 = uVar29 + 1;
          } while (uVar27 != uVar29);
          bVar12 = !bVar12;
          root = local_b0;
        }
        invalid_value = coda_NaN();
        local_110 = coda_conversion_new(1.0,1.0,0.0,invalid_value);
        if (local_110 == (coda_conversion *)0x0) goto LAB_001673f2;
        iVar25 = read_att_array(product,offset,&local_100,local_110);
        if (iVar25 != 0) goto LAB_001673ea;
        iVar25 = read_bytes(product->raw_product,*offset,4,&local_dc);
        if (iVar25 < 0) {
LAB_001673db:
          coda_dynamic_type_delete((coda_dynamic_type *)local_100);
LAB_001673ea:
          coda_conversion_delete(local_110);
LAB_001673f2:
          free(pcVar26);
          return -1;
        }
        auVar14._1_9_ = SUB169(ZEXT816(0) << 0x40,7);
        auVar14[0] = (char)(local_dc >> 0x18);
        auVar14._10_6_ = 0;
        auVar33._5_11_ = SUB1611(auVar14 << 0x30,5);
        auVar33[4] = (char)(local_dc >> 0x10);
        auVar33._0_4_ = local_dc;
        auVar31._12_4_ = 0;
        auVar31._0_12_ = auVar33._4_12_;
        auVar32._3_13_ = SUB1613(auVar31 << 0x20,3);
        auVar32[2] = (char)(local_dc >> 8);
        auVar32[0] = (byte)local_dc;
        auVar32[1] = 0;
        auVar31 = pshuflw(auVar32,auVar32,0x1b);
        sVar2 = auVar31._0_2_;
        sVar3 = auVar31._2_2_;
        sVar4 = auVar31._4_2_;
        sVar5 = auVar31._6_2_;
        local_dc = CONCAT13((0 < sVar5) * (sVar5 < 0x100) * auVar31[6] - (0xff < sVar5),
                            CONCAT12((0 < sVar4) * (sVar4 < 0x100) * auVar31[4] - (0xff < sVar4),
                                     CONCAT11((0 < sVar3) * (sVar3 < 0x100) * auVar31[2] -
                                              (0xff < sVar3),
                                              (0 < sVar2) * (sVar2 < 0x100) * auVar31[0] -
                                              (0xff < sVar2))));
        *offset = *offset + 4;
        pcVar10 = (char *)(ulong)local_dc;
        if (local_dc - 7 < 0xfffffffa) {
          coda_set_error(-300,"invalid netCDF file (invalid netcdf type (%d))");
          goto LAB_001673db;
        }
        local_f0 = pcVar10;
        if (((((local_110->numerator == 1.0) && (!NAN(local_110->numerator))) &&
             (local_110->add_offset == 0.0)) && (!NAN(local_110->add_offset))) &&
           ((local_dc - 7 < 0xfffffffe ||
            (iVar25 = coda_isNaN(local_110->invalid_value), iVar25 != 0)))) {
          coda_conversion_delete(local_110);
          local_110 = (coda_conversion *)0x0;
        }
        iVar25 = read_length_value(product,offset,&local_88);
        if (iVar25 != 0) goto LAB_001673db;
        if (record_var != 0) {
          product->record_size = product->record_size + local_88;
        }
        if (product->netcdf_version != 1) {
          iVar25 = read_bytes(product->raw_product,*offset,8,&local_d8);
          if (-1 < iVar25) {
            auVar13._8_6_ = 0;
            auVar13._0_8_ = local_d8;
            auVar13[0xe] = (char)(local_d8 >> 0x38);
            auVar20._8_4_ = 0;
            auVar20._0_8_ = local_d8;
            auVar20[0xc] = (char)(local_d8 >> 0x30);
            auVar20._13_2_ = auVar13._13_2_;
            auVar21._8_4_ = 0;
            auVar21._0_8_ = local_d8;
            auVar21._12_3_ = auVar20._12_3_;
            auVar22._8_2_ = 0;
            auVar22._0_8_ = local_d8;
            auVar22[10] = (char)(local_d8 >> 0x28);
            auVar22._11_4_ = auVar21._11_4_;
            auVar23._8_2_ = 0;
            auVar23._0_8_ = local_d8;
            auVar23._10_5_ = auVar22._10_5_;
            auVar24[8] = (char)(local_d8 >> 0x20);
            auVar24._0_8_ = local_d8;
            auVar24._9_6_ = auVar23._9_6_;
            uVar27 = CONCAT17(0,auVar24._8_7_);
            auVar19._8_8_ = 0;
            auVar19._0_8_ = uVar27;
            auVar18._1_9_ = SUB169(auVar19 << 0x40,7);
            auVar18[0] = (char)(local_d8 >> 0x18);
            auVar18._10_6_ = 0;
            auVar11._1_11_ = SUB1611(auVar18 << 0x30,5);
            auVar11[0] = (char)(local_d8 >> 0x10);
            auVar17._12_4_ = 0;
            auVar17._0_12_ = auVar11;
            auVar36._3_13_ = SUB1613(auVar17 << 0x20,3);
            auVar36[2] = (char)(local_d8 >> 8);
            auVar36[0] = (byte)local_d8;
            auVar36[1] = 0;
            auVar37._8_4_ = auVar36._0_4_;
            auVar37._0_8_ = uVar27;
            auVar37._12_4_ = auVar11._0_4_;
            auVar31 = pshuflw(auVar37,auVar37,0x1b);
            auVar31 = pshufhw(auVar31,auVar31,0x1b);
            sVar2 = auVar31._0_2_;
            sVar3 = auVar31._2_2_;
            sVar4 = auVar31._4_2_;
            sVar5 = auVar31._6_2_;
            sVar6 = auVar31._8_2_;
            sVar7 = auVar31._10_2_;
            sVar8 = auVar31._12_2_;
            sVar9 = auVar31._14_2_;
            local_d8 = CONCAT17((0 < sVar9) * (sVar9 < 0x100) * auVar31[0xe] - (0xff < sVar9),
                                CONCAT16((0 < sVar8) * (sVar8 < 0x100) * auVar31[0xc] -
                                         (0xff < sVar8),
                                         CONCAT15((0 < sVar7) * (sVar7 < 0x100) * auVar31[10] -
                                                  (0xff < sVar7),
                                                  CONCAT14((0 < sVar6) * (sVar6 < 0x100) *
                                                           auVar31[8] - (0xff < sVar6),
                                                           CONCAT13((0 < sVar5) * (sVar5 < 0x100) *
                                                                    auVar31[6] - (0xff < sVar5),
                                                                    CONCAT12((0 < sVar4) *
                                                                             (sVar4 < 0x100) *
                                                                             auVar31[4] -
                                                                             (0xff < sVar4),
                                                                             CONCAT11((0 < sVar3) *
                                                                                      (sVar3 < 0x100
                                                                                      ) * auVar31[2]
                                                                                      - (0xff < 
                                                  sVar3),(0 < sVar2) * (sVar2 < 0x100) * auVar31[0]
                                                         - (0xff < sVar2))))))));
            *offset = *offset + 8;
            goto LAB_001671ae;
          }
          goto LAB_001673db;
        }
        iVar25 = read_bytes(product->raw_product,*offset,4,&local_e0);
        if (iVar25 < 0) goto LAB_001673db;
        auVar16._1_9_ = SUB169(ZEXT816(0) << 0x40,7);
        auVar16[0] = (char)((uint)local_e0 >> 0x18);
        auVar16._10_6_ = 0;
        auVar35._5_11_ = SUB1611(auVar16 << 0x30,5);
        auVar35[4] = (char)((uint)local_e0 >> 0x10);
        auVar35._0_4_ = local_e0;
        auVar15._12_4_ = 0;
        auVar15._0_12_ = auVar35._4_12_;
        auVar34._3_13_ = SUB1613(auVar15 << 0x20,3);
        auVar34[2] = (char)((uint)local_e0 >> 8);
        auVar34[0] = (byte)local_e0;
        auVar34[1] = 0;
        auVar31 = pshuflw(auVar34,auVar34,0x1b);
        sVar2 = auVar31._0_2_;
        sVar3 = auVar31._2_2_;
        sVar4 = auVar31._4_2_;
        sVar5 = auVar31._6_2_;
        local_e0 = CONCAT13((0 < sVar5) * (sVar5 < 0x100) * auVar31[6] - (0xff < sVar5),
                            CONCAT12((0 < sVar4) * (sVar4 < 0x100) * auVar31[4] - (0xff < sVar4),
                                     CONCAT11((0 < sVar3) * (sVar3 < 0x100) * auVar31[2] -
                                              (0xff < sVar3),
                                              (0 < sVar2) * (sVar2 < 0x100) * auVar31[0] -
                                              (0xff < sVar2))));
        local_d8 = (ulong)local_e0;
        *offset = *offset + 4;
LAB_001671ae:
        iVar25 = (int)local_f0;
        if (product->file_size < (long)local_d8) {
          coda_set_error(-300,"invalid netCDF file (invalid offset for variable %s)",pcVar26);
          goto LAB_001673db;
        }
        if (bVar12) {
          record_var = 0;
          length_00 = 1;
LAB_001671f5:
          type = (coda_mem_record *)coda_netcdf_basic_type_new(iVar25,local_d8,record_var,length_00)
          ;
        }
        else {
          if ((iVar25 == 2) && (record_var == 0 || local_104 != 0)) {
            iVar25 = 2;
            length_00 = local_e8;
            goto LAB_001671f5;
          }
          type = (coda_mem_record *)coda_netcdf_basic_type_new(iVar25,local_d8,record_var,1);
          if (local_104 < 8) {
            local_78[local_104] = local_e8;
            local_104 = local_104 + 1;
          }
          else {
            local_78[7] = local_e8 * local_78[7];
          }
        }
        if (type == (coda_mem_record *)0x0) {
          coda_dynamic_type_delete((coda_dynamic_type *)local_100);
          goto LAB_001673ea;
        }
        if ((local_110 != (coda_conversion *)0x0) &&
           (iVar25 = coda_netcdf_basic_type_set_conversion((coda_netcdf_basic_type *)type,local_110)
           , iVar25 != 0)) {
          coda_dynamic_type_delete((coda_dynamic_type *)local_100);
          goto LAB_001673ea;
        }
        pcVar28 = local_100;
        if (local_104 != 0) {
          type_00 = (coda_mem_record *)
                    coda_netcdf_array_new(local_104,local_78,(coda_netcdf_basic_type *)type);
          pcVar28 = local_100;
          if (type_00 == (coda_mem_record *)0x0) {
            coda_dynamic_type_delete((coda_dynamic_type *)type);
            pcVar28 = local_100;
          }
          else {
            if ((local_100 == (coda_mem_record *)0x0) ||
               (iVar25 = coda_netcdf_array_set_attributes((coda_netcdf_array *)type_00,local_100),
               iVar25 == 0)) goto LAB_001672ab;
            coda_dynamic_type_delete((coda_dynamic_type *)type_00);
          }
          coda_dynamic_type_delete((coda_dynamic_type *)pcVar28);
          goto LAB_001673f2;
        }
        type_00 = type;
        if ((local_100 != (coda_mem_record *)0x0) &&
           (iVar25 = coda_netcdf_basic_type_set_attributes((coda_netcdf_basic_type *)type,local_100)
           , iVar25 != 0)) {
          coda_dynamic_type_delete((coda_dynamic_type *)type);
          type_00 = pcVar28;
LAB_00167425:
          coda_dynamic_type_delete((coda_dynamic_type *)type_00);
          goto LAB_001673f2;
        }
LAB_001672ab:
        iVar25 = coda_mem_record_add_field(root,pcVar26,(coda_dynamic_type *)type_00,1);
        lVar30 = local_d0;
        if (iVar25 != 0) goto LAB_00167425;
        free(pcVar26);
        lVar30 = lVar30 + 1;
        if (lVar30 == local_a8) {
          return 0;
        }
      } while( true );
    }
  }
  return 0;
}

Assistant:

static int read_var_array(coda_netcdf_product *product, int64_t *offset, int64_t num_dim_lengths, int64_t *dim_length,
                          int appendable_dim, coda_mem_record *root)
{
    int32_t tag;
    int64_t num_var;
    long i;

    if (read_bytes(product->raw_product, *offset, 4, &tag) < 0)
    {
        return -1;
    }
#ifndef WORDS_BIGENDIAN
    swap_int32(&tag);
#endif
    *offset += 4;

    if (read_length_value(product, offset, &num_var) != 0)
    {
        return -1;
    }

    if (tag == 0)
    {
        if (num_var != 0)
        {
            coda_set_error(CODA_ERROR_PRODUCT, "invalid netCDF file (invalid value for nelems for empty var_array)");
            return -1;
        }
        return 0;
    }

    if (tag != 11)      /* NC_VARIABLE */
    {
        coda_set_error(CODA_ERROR_PRODUCT, "invalid netCDF file (invalid value for NC_VARIABLE tag)");
        return -1;
    }

    for (i = 0; i < num_var; i++)
    {
        coda_netcdf_basic_type *basic_type;
        coda_mem_record *attributes = NULL;
        coda_conversion *conversion;
        long dim[CODA_MAX_NUM_DIMS];
        int64_t var_offset;
        int64_t string_length;
        int32_t nc_type;
        int64_t nelems;
        int64_t vsize;
        int64_t dim_id;
        char *name;
        long last_dim_length = 0;
        int last_dim_set = 0;
        int record_var = 0;
        int num_dims;
        long j;

        if (read_length_value(product, offset, &string_length) != 0)
        {
            return -1;
        }
        /* chars */
        name = malloc(string_length + 1);
        if (name == NULL)
        {
            coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not allocate %lu bytes) (%s:%u)",
                           (long)(string_length + 1), __FILE__, __LINE__);
            return -1;
        }
        name[string_length] = '\0';
        if (read_bytes(product->raw_product, *offset, string_length, name) < 0)
        {
            free(name);
            return -1;
        }
        *offset += string_length;
        /* chars padding */
        if ((string_length & 3) != 0)
        {
            *offset += 4 - (string_length & 3);
        }
        /* nelems */
        if (read_length_value(product, offset, &nelems) != 0)
        {
            free(name);
            return -1;
        }
        num_dims = 0;
        for (j = 0; j < nelems; j++)
        {
            /* dimid */
            if (read_length_value(product, offset, &dim_id) != 0)
            {
                free(name);
                return -1;
            }
            if (dim_id < 0 || dim_id >= num_dim_lengths)
            {
                coda_set_error(CODA_ERROR_PRODUCT, "invalid netCDF file (invalid dimid for variable %s)", name);
                free(name);
                return -1;
            }
            if (j == nelems - 1)
            {
                last_dim_length = (long)dim_length[dim_id];
                last_dim_set = 1;
            }
            else
            {
                if (j < CODA_MAX_NUM_DIMS)
                {
                    dim[j] = (long)dim_length[dim_id];
                    num_dims++;
                }
                else
                {
                    dim[CODA_MAX_NUM_DIMS - 1] *= (long)dim_length[dim_id];
                }
            }
            if (j == 0)
            {
                record_var = (dim_id == appendable_dim);
            }
        }

        conversion = coda_conversion_new(1.0, 1.0, 0.0, coda_NaN());
        if (conversion == NULL)
        {
            free(name);
            return -1;
        }
        /* vatt_array */
        if (read_att_array(product, offset, &attributes, conversion) != 0)
        {
            coda_conversion_delete(conversion);
            free(name);
            return -1;
        }

        /* nc_type */
        if (read_bytes(product->raw_product, *offset, 4, &nc_type) < 0)
        {
            coda_dynamic_type_delete((coda_dynamic_type *)attributes);
            coda_conversion_delete(conversion);
            free(name);
            return -1;
        }
#ifndef WORDS_BIGENDIAN
        swap_int32(&nc_type);
#endif
        *offset += 4;
        if (nc_type < 1 || nc_type > 6)
        {
            coda_set_error(CODA_ERROR_PRODUCT, "invalid netCDF file (invalid netcdf type (%d))", (int)nc_type);
            coda_dynamic_type_delete((coda_dynamic_type *)attributes);
            coda_conversion_delete(conversion);
            free(name);
            return -1;

        }

        /* check if we need to use a conversion */
        if (conversion->numerator == 1.0 && conversion->add_offset == 0.0)
        {
            /* don't create conversions for non-floating type data if we only have an 'invalid_value' attribute */
            if ((nc_type != 5 && nc_type != 6) || coda_isNaN(conversion->invalid_value))
            {
                coda_conversion_delete(conversion);
                conversion = NULL;
            }
        }

        /* vsize */
        if (read_length_value(product, offset, &vsize) != 0)
        {
            coda_dynamic_type_delete((coda_dynamic_type *)attributes);
            coda_conversion_delete(conversion);
            free(name);
            return -1;
        }
        if (record_var)
        {
            product->record_size += (long)vsize;
        }

        /* offset */
        if (product->netcdf_version == 1)
        {
            int32_t offset32;

            if (read_bytes(product->raw_product, *offset, 4, &offset32) < 0)
            {
                coda_dynamic_type_delete((coda_dynamic_type *)attributes);
                coda_conversion_delete(conversion);
                free(name);
                return -1;
            }
#ifndef WORDS_BIGENDIAN
            swap_int32(&offset32);
#endif
            var_offset = (int64_t)offset32;
            *offset += 4;
        }
        else
        {
            if (read_bytes(product->raw_product, *offset, 8, &var_offset) < 0)
            {
                coda_dynamic_type_delete((coda_dynamic_type *)attributes);
                coda_conversion_delete(conversion);
                free(name);
                return -1;
            }
#ifndef WORDS_BIGENDIAN
            swap_int64(&var_offset);
#endif
            *offset += 8;
        }
        if (var_offset > product->file_size)
        {
            coda_set_error(CODA_ERROR_PRODUCT, "invalid netCDF file (invalid offset for variable %s)", name);
            coda_dynamic_type_delete((coda_dynamic_type *)attributes);
            coda_conversion_delete(conversion);
            free(name);
            return -1;
        }
        if (last_dim_set)
        {
            if (nc_type == 2 && !(num_dims == 0 && record_var))
            {
                /* we treat the last dimension of a char array as a string */
                /* except if it is a one dimensional char array where the first dimension is the appendable dimension */
                basic_type = coda_netcdf_basic_type_new(nc_type, var_offset, record_var, last_dim_length);
            }
            else
            {
                basic_type = coda_netcdf_basic_type_new(nc_type, var_offset, record_var, 1);
                if (num_dims < CODA_MAX_NUM_DIMS)
                {
                    dim[num_dims] = last_dim_length;
                    num_dims++;
                }
                else
                {
                    dim[CODA_MAX_NUM_DIMS - 1] *= last_dim_length;
                }
            }
        }
        else
        {
            /* we only get here if the variable is a real scalar (num_dims == 0) */
            basic_type = coda_netcdf_basic_type_new(nc_type, var_offset, 0, 1);
        }
        if (basic_type == NULL)
        {
            coda_dynamic_type_delete((coda_dynamic_type *)attributes);
            coda_conversion_delete(conversion);
            free(name);
            return -1;
        }
        if (conversion != NULL)
        {
            if (coda_netcdf_basic_type_set_conversion(basic_type, conversion) != 0)
            {
                coda_dynamic_type_delete((coda_dynamic_type *)attributes);
                coda_conversion_delete(conversion);
                free(name);
                return -1;
            }
        }
        if (num_dims == 0)
        {
            if (attributes != NULL)
            {
                if (coda_netcdf_basic_type_set_attributes(basic_type, attributes) != 0)
                {
                    coda_dynamic_type_delete((coda_dynamic_type *)basic_type);
                    coda_dynamic_type_delete((coda_dynamic_type *)attributes);
                    free(name);
                    return -1;
                }
            }
            if (coda_mem_record_add_field(root, name, (coda_dynamic_type *)basic_type, 1) != 0)
            {
                coda_dynamic_type_delete((coda_dynamic_type *)basic_type);
                free(name);
                return -1;
            }
        }
        else
        {
            coda_netcdf_array *array;

            array = coda_netcdf_array_new(num_dims, dim, basic_type);
            if (array == NULL)
            {
                coda_dynamic_type_delete((coda_dynamic_type *)basic_type);
                coda_dynamic_type_delete((coda_dynamic_type *)attributes);
                free(name);
                return -1;
            }
            if (attributes != NULL)
            {
                if (coda_netcdf_array_set_attributes(array, attributes) != 0)
                {
                    coda_dynamic_type_delete((coda_dynamic_type *)array);
                    coda_dynamic_type_delete((coda_dynamic_type *)attributes);
                    free(name);
                    return -1;
                }
            }
            if (coda_mem_record_add_field(root, name, (coda_dynamic_type *)array, 1) != 0)
            {
                coda_dynamic_type_delete((coda_dynamic_type *)array);
                free(name);
                return -1;
            }
        }
        free(name);
    }

    return 0;
}